

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

uint64_t unodb::detail::
         key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>::critical_section_policy>
         ::make_u64(key_view k1,
                   basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_k2,
                   tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                   depth)

{
  value_type vVar1;
  uint length;
  uint64_t uVar2;
  uint64_t uVar3;
  span<const_std::byte,_18446744073709551615UL> sVar4;
  key_view key;
  unsigned_long_long k1_u64;
  value_type local_2c;
  undefined1 auStack_28 [4];
  tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
  depth_local;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> shifted_k2_local;
  key_view k1_local;
  
  shifted_k2_local.field_0.key._M_ptr = (pointer)shifted_k2.field_0._8_8_;
  _auStack_28 = shifted_k2.field_0._0_8_;
  shifted_k2_local.field_0.key._M_extent._M_extent_value =
       (__extent_storage<18446744073709551615UL>)k1._M_ptr;
  local_2c = depth.value;
  vVar1 = tree_depth::operator_cast_to_unsigned_int((tree_depth *)&local_2c);
  sVar4 = std::span<const_std::byte,_18446744073709551615UL>::subspan
                    ((span<const_std::byte,_18446744073709551615UL> *)
                     &shifted_k2_local.field_0.key._M_extent,(ulong)vVar1,0xffffffffffffffff);
  key._M_extent = sVar4._M_extent._M_extent_value;
  k1_u64 = (unsigned_long_long)sVar4._M_ptr;
  shifted_k2_local.field_0.key._M_extent._M_extent_value =
       (__extent_storage<18446744073709551615UL>)(__extent_storage<18446744073709551615UL>)k1_u64;
  key._M_ptr = (pointer)key._M_extent._M_extent_value;
  uVar2 = get_u64((detail *)k1_u64,key);
  uVar3 = basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::get_u64
                    ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                     auStack_28);
  length = shared_len(uVar2 & 0xffffffffffffff,uVar3,7);
  uVar3 = length_to_word(length);
  return uVar2 & 0xffffffffffffff | uVar3;
}

Assistant:

[[nodiscard, gnu::const]] static constexpr std::uint64_t make_u64(
      key_view k1, ArtKey shifted_k2, tree_depth<ArtKey> depth) noexcept {
    k1 = k1.subspan(depth);  // shift_right(depth)

    const auto k1_u64 = get_u64(k1) & key_bytes_mask;

    return k1_u64 | length_to_word(shared_len(k1_u64, shifted_k2.get_u64(),
                                              key_prefix_capacity));
  }